

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O2

void __thiscall Grammar::buildExtendedGrammar(Grammar *this)

{
  NameList *this_00;
  Name NVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  Rule local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  NVar1 = intern(this,"$accept");
  (this->accept_symbol)._M_node = NVar1._M_node;
  this_00 = &local_48.rhs;
  local_48.lhs._M_node = (_List_node_base *)0x0;
  local_48.rhs.
  super__List_base<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>.
  _M_impl._M_node._M_size = 0;
  local_48.prec._M_node = (_List_node_base *)0x0;
  local_48.rhs.
  super__List_base<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  local_48.rhs.
  super__List_base<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  iVar2 = std::__cxx11::list<Rule,_std::allocator<Rule>_>::emplace<Rule>
                    (&this->rules,(const_iterator)&this->rules,&local_48);
  (this->goal)._M_node = iVar2._M_node;
  std::__cxx11::
  _List_base<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>::_M_clear
            (&this_00->
              super__List_base<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
            );
  (this->goal)._M_node[1]._M_next = (this->accept_symbol)._M_node;
  std::__cxx11::list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>::
  push_back((list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_> *)
            &(this->goal)._M_node[1]._M_prev,&this->start);
  std::__cxx11::list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>::
  push_back((list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_> *)
            &(this->goal)._M_node[1]._M_prev,&this->tk_end);
  std::
  _Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
  ::_M_insert_unique<std::_List_iterator<QString>const&>
            ((_Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
              *)&this->non_terminals,&this->accept_symbol);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Grammar::buildExtendedGrammar ()
{
  accept_symbol = intern ("$accept");
  goal = rules.insert (rules.end (), Rule ());
  goal->lhs = accept_symbol;
  goal->rhs.push_back (start);
  goal->rhs.push_back (tk_end);

  non_terminals.insert (accept_symbol);
}